

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

cmJSONHelper<std::vector<PackagePreset>_> * __thiscall
cmJSONHelperBuilder::
Vector<cmCMakePresetsGraph::PackagePreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::PackagePreset>>
          (cmJSONHelper<std::vector<PackagePreset>_> *__return_storage_ptr__,
          cmJSONHelperBuilder *this,ErrorGenerator *error,
          Object<cmCMakePresetsGraph::PackagePreset> *func)

{
  vector<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::PackagePreset>::Member,_std::allocator<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::PackagePreset>::Member>_>
  vStack_68;
  undefined1 local_50;
  _Any_data local_48;
  code *local_38;
  char local_28;
  
  std::
  vector<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::PackagePreset>::Member,_std::allocator<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::PackagePreset>::Member>_>
  ::vector(&vStack_68,
           (vector<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::PackagePreset>::Member,_std::allocator<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::PackagePreset>::Member>_>
            *)error);
  local_50 = *(undefined1 *)&error->_M_invoker;
  std::
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function((function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_48,
             (function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)(error + 1));
  local_28 = error[2].super__Function_base._M_functor._M_pod_data[0];
  VectorFilter<cmCMakePresetsGraph::PackagePreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::PackagePreset>,cmJSONHelperBuilder::Vector<cmCMakePresetsGraph::PackagePreset,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::PackagePreset>>(std::function<void(Json::Value_const*,cmJSONState*)>,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::PackagePreset>)::_lambda(cmCMakePresetsGraph::PackagePreset_const&)_1_>
            (__return_storage_ptr__,this);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  std::
  vector<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::PackagePreset>::Member,_std::allocator<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::PackagePreset>::Member>_>
  ::~vector(&vStack_68);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<std::vector<T>> Vector(JsonErrors::ErrorGenerator error,
                                             F func)
  {
    return VectorFilter<T, F>(std::move(error), func,
                              [](const T&) { return true; });
  }